

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_eigensolver_sac.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  EigensolverSacProblem *this;
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar5;
  undefined1 auVar4 [16];
  undefined8 in_XMM2_Qb;
  timeval tVar6;
  timeval tVar7;
  size_t numberPoints;
  shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem> eigenproblem_ptr;
  bearingVectors_t bearingVectors2;
  bearingVectors_t bearingVectors1;
  vector<int,_std::allocator<int>_> camCorrespondences2;
  vector<int,_std::allocator<int>_> camCorrespondences1;
  timeval tic;
  rotations_t camRotations;
  translations_t camOffsets;
  timeval toc;
  MatrixXd gt;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  translation_t position;
  undefined1 local_300 [224];
  pointer local_220;
  pointer piStack_218;
  pointer piStack_210;
  pointer piStack_208;
  pointer piStack_200;
  pointer piStack_1f8;
  __shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
  _Stack_1f0;
  rotation_t rotation;
  rotation_t rotation2;
  CentralRelativeAdapter adapter;
  model_t optimizedModel;
  
  opengv::initializeRandomSeed();
  numberPoints = 100;
  local_300._8_4_ = 0;
  local_300._12_4_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&position1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_300);
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  rotation1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomDirectionTranslation(&position2,0.1);
  opengv::generateRandomRotation(&rotation2,0.5);
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  camOffsets.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  camRotations.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateCentralCameraSystem(&camOffsets,&camRotations);
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bearingVectors1.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bearingVectors2.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300._0_4_ = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&gt,(int *)local_300,&numberPoints);
  opengv::generateRandom2D2DCorrespondences
            (&position1,&rotation1,&position2,&rotation2,&camOffsets,&camRotations,numberPoints,0.5,
             0.1,&bearingVectors1,&bearingVectors2,&camCorrespondences1,&camCorrespondences2,&gt);
  opengv::extractRelativePose(&position1,&position2,&rotation1,&rotation2,&position,&rotation,true);
  opengv::printExperimentCharacteristics(&position,&rotation,0.5,0.1);
  opengv::relative_pose::CentralRelativeAdapter::CentralRelativeAdapter
            (&adapter,&bearingVectors1,&bearingVectors2,&rotation);
  local_300._8_4_ = 1000;
  local_300._16_8_ = 1.0;
  local_300._24_8_ = 0.99;
  local_220 = (pointer)0x0;
  piStack_218 = (pointer)0x0;
  piStack_210 = (pointer)0x0;
  piStack_208 = (pointer)0x0;
  piStack_200 = (pointer)0x0;
  piStack_1f8 = (pointer)0x0;
  _Stack_1f0._M_ptr = (element_type *)0x0;
  _Stack_1f0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_300._0_8_ = &PTR__SampleConsensus_003e8a18;
  this = (EigensolverSacProblem *)operator_new(0x13f0);
  opengv::sac_problems::relative_pose::EigensolverSacProblem::EigensolverSacProblem
            (this,&adapter.super_RelativeAdapterBase,10,true);
  std::
  __shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,void>
            ((__shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,(__gnu_cxx::_Lock_policy)2>
              *)&eigenproblem_ptr,this);
  std::
  __shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&_Stack_1f0,
              &eigenproblem_ptr.
               super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
             );
  local_300._16_8_ = 1.0;
  local_300._8_4_ = 100;
  gettimeofday((timeval *)&tic,(__timezone_ptr_t)0x0);
  opengv::sac::Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem>::computeModel
            ((Ransac<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)local_300,0);
  gettimeofday((timeval *)&toc,(__timezone_ptr_t)0x0);
  tVar6 = timeval_minus(&toc,&tic);
  tVar7 = timeval_minus(&toc,&tic);
  (*((eigenproblem_ptr.
      super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_SampleConsensusProblem<opengv::EigensolverOutput>)._vptr_SampleConsensusProblem
    [6])(eigenproblem_ptr.
         super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr,&piStack_208,local_300 + 0x20,&optimizedModel);
  poVar1 = std::operator<<((ostream *)&std::cout,"the ransac results is: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(local_300 + 0x38))
  ;
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ransac needed ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_300._12_4_);
  uVar5 = extraout_XMM1_Qb;
  std::operator<<(poVar1," iterations and ");
  auVar4._0_8_ = (double)tVar6.tv_sec;
  auVar4._8_8_ = uVar5;
  auVar3._0_8_ = (double)tVar7.tv_usec;
  auVar3._8_8_ = in_XMM2_Qb;
  auVar3 = vfmadd132sd_fma(auVar3,auVar4,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar1 = std::ostream::_M_insert<double>(auVar3._0_8_);
  poVar1 = std::operator<<(poVar1," seconds");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"the number of inliers is: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"the found inliers are: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar2 = 0; uVar2 < (ulong)((long)piStack_200 - (long)piStack_208 >> 2); uVar2 = uVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piStack_208[uVar2]);
    std::operator<<(poVar1," ");
  }
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"the optimized result is: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             &optimizedModel.rotation);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&eigenproblem_ptr.
              super___shared_ptr<opengv::sac_problems::relative_pose::EigensolverSacProblem,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  opengv::sac::SampleConsensus<opengv::sac_problems::relative_pose::EigensolverSacProblem>::
  ~SampleConsensus((SampleConsensus<opengv::sac_problems::relative_pose::EigensolverSacProblem> *)
                   local_300);
  opengv::relative_pose::CentralRelativeAdapter::~CentralRelativeAdapter(&adapter);
  Eigen::internal::handmade_aligned_free
            (gt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&camCorrespondences2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&camCorrespondences1.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&bearingVectors2.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&bearingVectors1.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&camRotations.
                   super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&camOffsets.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.5;
  double outlierFraction = 0.1;
  size_t numberPoints = 100;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomDirectionTranslation(0.1);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors1;
  bearingVectors_t bearingVectors2;
  std::vector<int> camCorrespondences1; //unused in the central case
  std::vector<int> camCorrespondences2; //unused in the central case
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D2DCorrespondences(
      position1, rotation1, position2, rotation2,
      camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors1, bearingVectors2,
      camCorrespondences1, camCorrespondences2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );

  //create a central relative adapter
  relative_pose::CentralRelativeAdapter adapter(
      bearingVectors1,
      bearingVectors2,
      rotation);

  //Create an EigensolverSacProblem and Ransac
  //The number of samples can be configured
  sac::Ransac<
      sac_problems::relative_pose::EigensolverSacProblem> ransac;
  std::shared_ptr<
      sac_problems::relative_pose::EigensolverSacProblem> eigenproblem_ptr(
      new sac_problems::relative_pose::EigensolverSacProblem(adapter,10));
  ransac.sac_model_ = eigenproblem_ptr;
  ransac.threshold_ = 1.0;
  ransac.max_iterations_ = 100;

  //Run the experiment
  struct timeval tic;
  struct timeval toc;
  gettimeofday( &tic, 0 );
  ransac.computeModel();
  gettimeofday( &toc, 0 );
  double ransac_time = TIMETODOUBLE(timeval_minus(toc,tic));

  //do final polishing of the model over all inliers
  sac_problems::relative_pose::EigensolverSacProblem::model_t optimizedModel;
  eigenproblem_ptr->optimizeModelCoefficients(
      ransac.inliers_,
      ransac.model_coefficients_,
      optimizedModel);

  //print the results
  std::cout << "the ransac results is: " << std::endl;
  std::cout << ransac.model_coefficients_.rotation << std::endl << std::endl;
  std::cout << "Ransac needed " << ransac.iterations_ << " iterations and ";
  std::cout << ransac_time << " seconds" << std::endl << std::endl;
  std::cout << "the number of inliers is: " << ransac.inliers_.size();
  std::cout << std::endl << std::endl;
  std::cout << "the found inliers are: " << std::endl;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
    std::cout << ransac.inliers_[i] << " ";
  std::cout << std::endl << std::endl;
  std::cout << "the optimized result is: " << std::endl;
  std::cout << optimizedModel.rotation << std::endl;
}